

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_realpath(uv_fs_t *req)

{
  char *pcVar1;
  char *buf;
  uv_fs_t *req_local;
  
  pcVar1 = realpath(req->path,(char *)0x0);
  if (pcVar1 == (char *)0x0) {
    req_local = (uv_fs_t *)0xffffffffffffffff;
  }
  else {
    req->ptr = pcVar1;
    req_local = (uv_fs_t *)0x0;
  }
  return (ssize_t)req_local;
}

Assistant:

static ssize_t uv__fs_realpath(uv_fs_t* req) {
  char* buf;

#if defined(_POSIX_VERSION) && _POSIX_VERSION >= 200809L
  buf = realpath(req->path, NULL);
  if (buf == NULL)
    return -1;
#else
  ssize_t len;

  len = uv__fs_pathmax_size(req->path);
  buf = uv__malloc(len + 1);

  if (buf == NULL) {
    errno = ENOMEM;
    return -1;
  }

  if (realpath(req->path, buf) == NULL) {
    uv__free(buf);
    return -1;
  }
#endif

  req->ptr = buf;

  return 0;
}